

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall server_slot::print_timings(server_slot *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  common_log *pcVar9;
  uint *in_RDI;
  float draft_ratio;
  double n_gen_second;
  double t_gen;
  double n_prompt_second;
  double t_prompt;
  
  dVar1 = *(double *)(in_RDI + 0x216);
  uVar5 = in_RDI[0x1db];
  dVar2 = *(double *)(in_RDI + 0x216);
  uVar6 = in_RDI[0x1db];
  dVar3 = *(double *)(in_RDI + 0x218);
  uVar7 = in_RDI[0x1d6];
  dVar4 = *(double *)(in_RDI + 0x218);
  uVar8 = in_RDI[0x1d6];
  if (-1 < common_log_verbosity_thold) {
    pcVar9 = common_log_main();
    common_log_add(*(common_log **)(in_RDI + 0x216),(ggml_log_level)(dVar1 / (double)(int)uVar5),
                   (char *)((1000.0 / dVar2) * (double)(int)uVar6),*(undefined8 *)(in_RDI + 0x218),
                   dVar3 / (double)(int)uVar7,(1000.0 / dVar4) * (double)(int)uVar8,
                   *(double *)(in_RDI + 0x216) + *(double *)(in_RDI + 0x218),pcVar9,2,
                   "slot %12.*s: id %2d | task %d | \nprompt eval time = %10.2f ms / %5d tokens (%8.2f ms per token, %8.2f tokens per second)\n       eval time = %10.2f ms / %5d tokens (%8.2f ms per token, %8.2f tokens per second)\n      total time = %10.2f ms / %5d tokens\n"
                   ,0xc,"print_timings",(ulong)*in_RDI,in_RDI[1],in_RDI[0x1db],in_RDI[0x1d6],
                   in_RDI[0x1db] + in_RDI[0x1d6]);
  }
  if ((0 < (int)in_RDI[0x222]) &&
     (uVar5 = in_RDI[0x223], uVar6 = in_RDI[0x222], -1 < common_log_verbosity_thold)) {
    pcVar9 = common_log_main();
    common_log_add((common_log *)(double)((float)(int)uVar5 / (float)(int)uVar6),
                   (ggml_log_level)pcVar9,(char *)0x2,
                   "slot %12.*s: id %2d | task %d | \ndraft acceptance rate = %0.5f (%5d accepted / %5d generated)\n"
                   ,0xc,"print_timings",(ulong)*in_RDI,in_RDI[1],in_RDI[0x223],in_RDI[0x222]);
  }
  return;
}

Assistant:

void print_timings() const {
        const double t_prompt        =       t_prompt_processing / n_prompt_tokens_processed;
        const double n_prompt_second = 1e3 / t_prompt_processing * n_prompt_tokens_processed;

        const double t_gen        =       t_token_generation / n_decoded;
        const double n_gen_second = 1e3 / t_token_generation * n_decoded;

        SLT_INF(*this,
                "\n"
                "prompt eval time = %10.2f ms / %5d tokens (%8.2f ms per token, %8.2f tokens per second)\n"
                "       eval time = %10.2f ms / %5d tokens (%8.2f ms per token, %8.2f tokens per second)\n"
                "      total time = %10.2f ms / %5d tokens\n",
                t_prompt_processing, n_prompt_tokens_processed, t_prompt, n_prompt_second,
                t_token_generation, n_decoded, t_gen, n_gen_second,
                t_prompt_processing + t_token_generation, n_prompt_tokens_processed + n_decoded);

        if (n_draft_total > 0) {
            const float draft_ratio = (float) n_draft_accepted / n_draft_total;
            SLT_INF(*this,
                    "\n"
                    "draft acceptance rate = %0.5f (%5d accepted / %5d generated)\n",
                    draft_ratio, n_draft_accepted, n_draft_total
            );
        }
    }